

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_warnings_off(APITests *this)

{
  byte bVar1;
  runtime_error *this_00;
  Warning w;
  Warning *in_stack_fffffffffffffe28;
  string local_1c8 [8];
  Warning *in_stack_fffffffffffffe40;
  Warning *in_stack_fffffffffffffe60;
  
  GPIO::setwarnings(false);
  Warning::Warning(in_stack_fffffffffffffe60);
  GPIO::cleanup();
  Warning::contents_abi_cxx11_(in_stack_fffffffffffffe28);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_1c8);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    Warning::~Warning(in_stack_fffffffffffffe40);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unexpected warning occured");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_warnings_off()
    {
        GPIO::setwarnings(false);
        Warning w{};

        // cleanup() warns if no GPIOs were set up
        GPIO::cleanup();

        if (!w.contents().empty())
            throw std::runtime_error("Unexpected warning occured");
    }